

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O3

bool __thiscall iutest::TempFile::Create(TempFile *this,char *basename)

{
  int iVar1;
  string name_template;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/tmp/","");
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append((char *)local_40);
  iVar1 = mkstemp((char *)local_40[0]);
  this->m_fd = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->m_filename);
  iVar1 = this->m_fd;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return iVar1 != -1;
}

Assistant:

bool Create(const char* basename)
    {
#if defined(IUTEST_OS_WINDOWS)
        char tmp_dir[IUTEST_MAX_PATH] = { '\0' };
        GetTempPathA(sizeof(tmp_dir), tmp_dir);

        char name_template[IUTEST_MAX_PATH] = { '\0' };
        UINT ret = GetTempFileNameA(tmp_dir, basename, 0, name_template);
        IUTEST_CHECK_(ret != 0) << "Unable to create a temporary file in " << tmp_dir;
#if defined(_CRT_FUNCTIONS_REQUIRED)
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_BEGIN()
        const int fd = _creat(name_template, _S_IREAD | _S_IWRITE);
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_END()
#else
#if defined(IUTEST_OS_WINDOWS_MINGW)
        const int fd = _sopen(name_template, _O_CREAT | _O_RDWR, _SH_DENYNO, _S_IREAD | _S_IWRITE);
#else
        int fd = -1;
        _sopen_s(&fd, name_template, _O_CREAT | _O_RDWR, _SH_DENYNO, _S_IREAD | _S_IWRITE);
#endif
#endif
#else
#if   defined(IUTEST_OS_LINUX_ANDROID)
        ::std::string name_template = "/data/local/tmp/";
#elif defined(IUTEST_OS_IOS)
        char user_temp_dir[IUTEST_MAX_PATH];
        ::confstr(_CS_DARWIN_USER_TEMP_DIR, user_temp_dir, sizeof(user_temp_dir));
        ::std::string name_template = user_temp_dir;
        name_template += "/";
#else
        ::std::string name_template = "/tmp/";
#endif
        name_template += basename;
        name_template += ".XXXXXX";
        const int fd = internal::posix::Mkstemp(const_cast<char*>(name_template.data()));
#endif
        m_fd = fd;
        m_filename = name_template;
        return m_fd != -1;
    }